

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdlogger.cpp
# Opt level: O2

void __thiscall CfdLogger_WriteLog_Test::TestBody(CfdLogger_WriteLog_Test *this)

{
  bool bVar1;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [4];
  CfdSourceLocation loc;
  
  loc.funcname = "";
  loc.filename = "";
  loc.line = 0;
  loc._12_4_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)local_48,"",(allocator *)&local_50);
      cfd::core::logger::WriteLog(&loc,kCfdLogLevelInfo,(string *)local_48);
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  else {
    testing::Message::Message((Message *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_cfdlogger.cpp"
               ,0x16,
               "Expected: (WriteLog(loc, CfdLogLevel::kCfdLogLevelInfo, \"\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_48);
  }
  return;
}

Assistant:

TEST(CfdLogger, WriteLog) {
  CfdSourceLocation loc {"", 0, ""};
  EXPECT_NO_THROW((WriteLog(loc, CfdLogLevel::kCfdLogLevelInfo, "")));
}